

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

CURLcode telnet_do(Curl_easy *data,_Bool *done)

{
  char *str;
  uchar **ppuVar1;
  uchar *puVar2;
  byte bVar3;
  curl_socket_t cVar4;
  connectdata *pcVar5;
  TELNET *pTVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  ulong uVar9;
  ssize_t sVar10;
  undefined8 uVar11;
  _Bool _Var12;
  char cVar13;
  int iVar14;
  CURLcode CVar15;
  CURLcode CVar16;
  uint uVar17;
  TELNET *pTVar18;
  curl_slist *pcVar19;
  char *pcVar20;
  ulong uVar21;
  ulong uVar22;
  curl_slist *pcVar23;
  size_t sVar24;
  timediff_t tVar25;
  byte *pbVar26;
  TELNET *pTVar27;
  char *pcVar28;
  ulong uVar29;
  curl_slist **ppcVar30;
  long lVar31;
  uint nfds;
  uint uVar32;
  bool bVar33;
  curltime older;
  curltime cVar34;
  curltime newer;
  ssize_t nread;
  pollfd pfd [2];
  timediff_t local_1060;
  long local_1050;
  long local_1048;
  char buffer [4096];
  
  pcVar5 = data->conn;
  cVar4 = pcVar5->sock[0];
  *done = true;
  pTVar18 = (TELNET *)(*Curl_ccalloc)(1,0x1e58);
  if (pTVar18 == (TELNET *)0x0) {
LAB_00154e34:
    CVar15 = CURLE_OUT_OF_MEMORY;
  }
  else {
    Curl_dyn_init(&pTVar18->out,0xffff);
    (data->req).p.telnet = pTVar18;
    pTVar18->telrcv_state = CURL_TS_DATA;
    pTVar18->subpointer = pTVar18->subbuffer;
    pTVar18->us_preferred[3] = 1;
    pTVar18->him_preferred[3] = 1;
    pTVar18->us_preferred[0] = 1;
    pTVar18->him_preferred[0] = 1;
    pTVar18->him_preferred[1] = 1;
    pTVar18->subnegotiation[0x1f] = 1;
    pTVar18 = (data->req).p.telnet;
    if ((data->state).aptr.user != (char *)0x0) {
      pcVar28 = data->conn->user;
      _Var12 = str_is_nonascii(pcVar28);
      if (_Var12) {
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      curl_msnprintf(buffer,0x100,"USER,%s",pcVar28);
      pcVar19 = curl_slist_append(pTVar18->telnet_vars,buffer);
      if (pcVar19 == (curl_slist *)0x0) {
        curl_slist_free_all(pTVar18->telnet_vars);
        pTVar18->telnet_vars = (curl_slist *)0x0;
        goto LAB_00154e34;
      }
      pTVar18->telnet_vars = pcVar19;
      pTVar18->us_preferred[0x27] = 1;
    }
    CVar15 = CURLE_OK;
    ppcVar30 = &(data->set).telnet_options;
    while ((CVar15 == CURLE_OK && (pcVar19 = *ppcVar30, pcVar19 != (curl_slist *)0x0))) {
      pcVar28 = pcVar19->data;
      pcVar20 = strchr(pcVar28,0x3d);
      if (pcVar20 == (char *)0x0) {
LAB_00154b7e:
        Curl_failf(data,"Syntax error in telnet option: %s",pcVar28);
        CVar15 = CURLE_SETOPT_OPTION_SYNTAX;
      }
      else {
        str = pcVar20 + 1;
        _Var12 = str_is_nonascii(str);
        if (_Var12) {
LAB_00154b6c:
          CVar15 = CURLE_OK;
        }
        else {
          switch((long)pcVar20 - (long)pcVar28) {
          case 2:
            iVar14 = curl_strnequal(pcVar28,"WS",2);
            CVar15 = CURLE_UNKNOWN_OPTION;
            if (iVar14 != 0) {
              uVar21 = strtoul(str,(char **)buffer,10);
              uVar11 = buffer._0_8_;
              if ((uVar21 - 1 < 0xffff) &&
                 (cVar13 = Curl_raw_tolower(*(char *)buffer._0_8_), cVar13 == 'x')) {
                uVar22 = strtoul((char *)(uVar11 + 1),(char **)0x0,10);
                if (uVar22 - 1 < 0xffff) {
                  pTVar18->subopt_wsx = (unsigned_short)uVar21;
                  pTVar18->subopt_wsy = (unsigned_short)uVar22;
                  pTVar18->us_preferred[0x1f] = 1;
                  goto LAB_00154b6c;
                }
                CVar15 = CURLE_OK;
                if (uVar22 != 0) break;
              }
              pcVar28 = pcVar19->data;
              goto LAB_00154b7e;
            }
            break;
          default:
            Curl_failf(data,"Unknown telnet option %s",pcVar28);
            CVar15 = CURLE_UNKNOWN_OPTION;
            break;
          case 5:
            iVar14 = curl_strnequal(pcVar28,"TTYPE",5);
            CVar15 = CURLE_UNKNOWN_OPTION;
            if (iVar14 != 0) {
              pTVar18->subopt_ttype = str;
              pTVar18->us_preferred[0x18] = 1;
              goto LAB_00154b6c;
            }
            break;
          case 6:
            iVar14 = curl_strnequal(pcVar28,"BINARY",6);
            CVar15 = CURLE_UNKNOWN_OPTION;
            if (iVar14 != 0) {
              iVar14 = atoi(str);
              if (iVar14 != 1) {
                pTVar18->us_preferred[0] = 0;
                pTVar18->him_preferred[0] = 0;
              }
              goto LAB_00154b6c;
            }
            break;
          case 7:
            iVar14 = curl_strnequal(pcVar28,"NEW_ENV",7);
            CVar15 = CURLE_UNKNOWN_OPTION;
            if (iVar14 != 0) {
              pcVar23 = curl_slist_append(pTVar18->telnet_vars,str);
              CVar15 = CURLE_OUT_OF_MEMORY;
              if (pcVar23 != (curl_slist *)0x0) {
                pTVar18->telnet_vars = pcVar23;
                pTVar18->us_preferred[0x27] = 1;
                goto LAB_00154b6c;
              }
            }
            break;
          case 8:
            iVar14 = curl_strnequal(pcVar28,"XDISPLOC",8);
            CVar15 = CURLE_UNKNOWN_OPTION;
            if (iVar14 != 0) {
              pTVar18->subopt_xdisploc = str;
              pTVar18->us_preferred[0x23] = 1;
              goto LAB_00154b6c;
            }
          }
        }
      }
      ppcVar30 = &pcVar19->next;
    }
    if (CVar15 == CURLE_OK) {
      pfd[0].events = 1;
      uVar21 = *(ulong *)&(data->set).field_0x8ca;
      CVar15 = CURLE_OK;
      bVar33 = true;
      pfd[0].fd = cVar4;
      if ((uVar21 & 2) == 0) {
        pfd[1].fd = fileno((FILE *)(data->state).in);
        pfd[1].events = 1;
        local_1060 = 1000;
        nfds = 2;
        if (pfd[1].fd < 0) {
          bVar33 = false;
          Curl_failf(data,"cannot read input");
          CVar15 = CURLE_RECV_ERROR;
        }
      }
      else {
        local_1060 = 100;
        nfds = 1;
      }
      local_1048 = 0;
      local_1050 = 0;
LAB_00154e70:
      if (bVar33) {
        iVar14 = Curl_poll(pfd,nfds,local_1060);
        if (iVar14 == 0) {
          pfd[0].revents = 0;
          pfd[1].revents = 0;
          goto LAB_00154edf;
        }
        if (iVar14 != -1) {
          if ((pfd[0].revents & 1U) == 0) goto LAB_00154edf;
          CVar15 = Curl_xfer_recv(data,buffer,0x1000,&nread);
          if (CVar15 != CURLE_OK) {
            bVar33 = true;
            if (CVar15 == CURLE_AGAIN) goto LAB_00154fd7;
            goto LAB_00154fb9;
          }
          if (nread < 1) {
            bVar33 = false;
            CVar15 = CURLE_OK;
          }
          else {
            local_1050 = local_1050 + nread;
            CVar15 = Curl_pgrsSetDownloadCounter(data,local_1050);
            sVar10 = nread;
            if (CVar15 != CURLE_OK) goto LAB_00154fb9;
            pTVar6 = (data->req).p.telnet;
            ppuVar1 = &pTVar6->subpointer;
            puVar2 = pTVar6->subbuffer;
            uVar29 = 0;
            uVar22 = 0xffffffffffffffff;
            while( true ) {
              uVar32 = (uint)uVar22;
              if (sVar10 == uVar29) break;
              uVar17 = uVar32;
              if (CURL_TS_SE < pTVar6->telrcv_state) goto LAB_001556be;
              bVar3 = buffer[uVar29];
              switch(pTVar6->telrcv_state) {
              case CURL_TS_DATA:
                if (bVar3 == 0xd) {
                  pTVar6->telrcv_state = CURL_TS_CR;
                }
                else if (bVar3 == 0xff) {
                  pTVar6->telrcv_state = CURL_TS_IAC;
                  goto LAB_00155299;
                }
LAB_001555a8:
                uVar9 = uVar29;
                if (-1 < (int)uVar32) {
                  uVar9 = uVar22;
                }
                uVar17 = (uint)uVar9;
                break;
              case CURL_TS_IAC:
switchD_001550ae_caseD_1:
                switch(bVar3) {
                case 0xfa:
                  pTVar6->subpointer = puVar2;
LAB_00155421:
                  pTVar6->telrcv_state = CURL_TS_SB;
                  break;
                case 0xfb:
                  pTVar6->telrcv_state = CURL_TS_WILL;
                  break;
                case 0xfc:
                  pTVar6->telrcv_state = CURL_TS_WONT;
                  break;
                case 0xfd:
                  pTVar6->telrcv_state = CURL_TS_DO;
                  break;
                case 0xfe:
                  pTVar6->telrcv_state = CURL_TS_DONT;
                  break;
                case 0xff:
                  pTVar6->telrcv_state = CURL_TS_DATA;
                  goto LAB_001555a8;
                default:
                  pTVar6->telrcv_state = CURL_TS_DATA;
                  printoption(data,"RCVD",0xff,(uint)bVar3);
                }
                break;
              case CURL_TS_WILL:
                printoption(data,"RCVD",0xfb,(uint)bVar3);
                pTVar6->please_negotiate = 1;
                pTVar27 = (data->req).p.telnet;
                iVar14 = pTVar27->him[bVar3];
                if (iVar14 == 3) {
                  iVar14 = pTVar27->himq[bVar3];
                  if (iVar14 != 1) goto LAB_00155505;
                  pTVar27->him[bVar3] = 1;
LAB_001554e6:
                  pTVar27->himq[bVar3] = 0;
                }
                else if (iVar14 == 2) {
                  if (pTVar27->himq[bVar3] == 1) {
                    pTVar27->him[bVar3] = 3;
                    pTVar27->himq[bVar3] = 0;
                    goto LAB_00155668;
                  }
                  if (pTVar27->himq[bVar3] == 0) {
                    pTVar27->him[bVar3] = 1;
                  }
                }
                else if (iVar14 == 0) {
                  if (pTVar27->him_preferred[bVar3] == 1) {
                    pTVar27->him[bVar3] = 1;
                    goto LAB_00155687;
                  }
LAB_00155668:
                  iVar14 = 0xfe;
                  goto LAB_001556ab;
                }
                goto LAB_001556b3;
              case CURL_TS_WONT:
                printoption(data,"RCVD",0xfc,(uint)bVar3);
                pTVar6->please_negotiate = 1;
                pTVar27 = (data->req).p.telnet;
                iVar14 = pTVar27->him[bVar3];
                if (iVar14 == 3) {
                  iVar14 = pTVar27->himq[bVar3];
                  if (iVar14 == 1) {
                    pTVar27->him[bVar3] = 2;
                    pTVar27->himq[bVar3] = 0;
LAB_00155687:
                    iVar14 = 0xfd;
                    goto LAB_001556ab;
                  }
                }
                else {
                  if (iVar14 != 2) {
                    if (iVar14 == 1) {
                      pTVar27->him[bVar3] = 0;
                      goto LAB_00155668;
                    }
                    goto LAB_001556b3;
                  }
                  iVar14 = pTVar27->himq[bVar3];
                  if (iVar14 == 1) {
                    pTVar27->him[bVar3] = 0;
                    goto LAB_001554e6;
                  }
                }
LAB_00155505:
                if (iVar14 == 0) {
                  pTVar27->him[bVar3] = 0;
                }
                goto LAB_001556b3;
              case CURL_TS_DO:
                printoption(data,"RCVD",0xfd,(uint)bVar3);
                pTVar6->please_negotiate = 1;
                pTVar27 = (data->req).p.telnet;
                iVar14 = pTVar27->us[bVar3];
                if (iVar14 == 3) {
                  if (pTVar27->usq[bVar3] == 1) {
                    pTVar27->us[bVar3] = 1;
                    pTVar27->usq[bVar3] = 0;
                  }
                  else if (pTVar27->usq[bVar3] == 0) {
                    pTVar27->us[bVar3] = 0;
                  }
                }
                else if (iVar14 == 2) {
                  if (pTVar27->usq[bVar3] == 1) {
                    pTVar27->us[bVar3] = 3;
                    pTVar27->himq[bVar3] = 0;
LAB_0015561d:
                    send_negotiation(data,0xfc,(uint)bVar3);
                  }
                  else if (pTVar27->usq[bVar3] == 0) {
                    pTVar27->us[bVar3] = 1;
                    goto LAB_00155453;
                  }
                }
                else if (iVar14 == 0) {
                  if (pTVar27->us_preferred[bVar3] == 1) {
                    pTVar27->us[bVar3] = 1;
                    send_negotiation(data,0xfb,(uint)bVar3);
LAB_00155453:
                    if (pTVar27->subnegotiation[bVar3] != 1) goto LAB_00155641;
                  }
                  else {
                    if (pTVar27->subnegotiation[bVar3] != 1) goto LAB_0015561d;
                    pTVar27->us[bVar3] = 1;
                    send_negotiation(data,0xfb,(uint)bVar3);
                  }
                  sendsuboption(data,(uint)bVar3);
                }
LAB_00155641:
                pTVar6->telrcv_state = CURL_TS_DATA;
                break;
              case CURL_TS_DONT:
                printoption(data,"RCVD",0xfe,(uint)bVar3);
                pTVar6->please_negotiate = 1;
                pTVar27 = (data->req).p.telnet;
                iVar14 = pTVar27->us[bVar3];
                if (iVar14 == 3) {
                  iVar14 = pTVar27->usq[bVar3];
                  if (iVar14 == 1) {
                    pTVar27->us[bVar3] = 2;
                    pTVar27->usq[bVar3] = 0;
                    iVar14 = 0xfb;
LAB_001556ab:
                    send_negotiation(data,iVar14,(uint)bVar3);
                  }
                  else {
LAB_0015554d:
                    if (iVar14 == 0) {
                      pTVar27->us[bVar3] = 0;
                    }
                  }
                }
                else if (iVar14 == 2) {
                  iVar14 = pTVar27->usq[bVar3];
                  if (iVar14 != 1) goto LAB_0015554d;
                  pTVar27->us[bVar3] = 0;
                  pTVar27->usq[bVar3] = 0;
                }
                else if (iVar14 == 1) {
                  pTVar27->us[bVar3] = 0;
                  iVar14 = 0xfc;
                  goto LAB_001556ab;
                }
                goto LAB_001556b3;
              case CURL_TS_CR:
                pTVar6->telrcv_state = CURL_TS_DATA;
                if (bVar3 != 0) goto LAB_001555a8;
LAB_00155299:
                uVar17 = 0xffffffff;
                if (-1 < (int)uVar32) {
                  CVar15 = Curl_client_write(data,1,buffer + (uVar22 & 0xffffffff),
                                             (long)(int)((int)uVar29 - uVar32));
                  uVar17 = 0xffffffff;
                  if (CVar15 != CURLE_OK) goto LAB_001556f3;
                }
                break;
              case CURL_TS_SB:
                if (bVar3 == 0xff) {
                  pTVar6->telrcv_state = CURL_TS_SE;
                }
                else {
                  pbVar26 = *ppuVar1;
                  if (pbVar26 < ppuVar1) {
                    *ppuVar1 = pbVar26 + 1;
                    *pbVar26 = bVar3;
                  }
                }
                break;
              case CURL_TS_SE:
                pbVar26 = *ppuVar1;
                if (bVar3 != 0xf0) {
                  if (bVar3 != 0xff) {
                    if (pbVar26 < ppuVar1) {
                      *ppuVar1 = pbVar26 + 1;
                      *pbVar26 = 0xff;
                      pbVar26 = *ppuVar1;
                    }
                    if (pbVar26 < ppuVar1) {
                      *ppuVar1 = pbVar26 + 1;
                      *pbVar26 = bVar3;
                      pbVar26 = *ppuVar1;
                    }
                    pTVar6->subend = pbVar26 + -2;
                    pTVar6->subpointer = puVar2;
                    printoption(data,"In SUBOPTION processing, RCVD",0xff,(uint)bVar3);
                    suboption(data);
                    pTVar6->telrcv_state = CURL_TS_IAC;
                    goto switchD_001550ae_caseD_1;
                  }
                  if (pbVar26 < ppuVar1) {
                    *ppuVar1 = pbVar26 + 1;
                    *pbVar26 = 0xff;
                  }
                  goto LAB_00155421;
                }
                if (pbVar26 < ppuVar1) {
                  *ppuVar1 = pbVar26 + 1;
                  *pbVar26 = 0xff;
                  pbVar26 = *ppuVar1;
                }
                if (pbVar26 < ppuVar1) {
                  *ppuVar1 = pbVar26 + 1;
                  *pbVar26 = 0xf0;
                  pbVar26 = *ppuVar1;
                }
                pTVar6->subend = pbVar26 + -2;
                pTVar6->subpointer = puVar2;
                suboption(data);
LAB_001556b3:
                pTVar6->telrcv_state = CURL_TS_DATA;
              }
LAB_001556be:
              uVar29 = uVar29 + 1;
              uVar22 = (ulong)uVar17;
            }
            if (((int)uVar32 < 0) ||
               (CVar15 = Curl_client_write(data,1,buffer + (uVar22 & 0xffffffff),
                                           (long)(int)((int)sVar10 - uVar32)), CVar15 == CURLE_OK))
            {
              CVar15 = CURLE_OK;
              if ((pTVar18->please_negotiate != 0) && (pTVar18->already_negotiated == 0)) {
                pTVar6 = (data->req).p.telnet;
                lVar31 = 0;
                do {
                  if (lVar31 != 1) {
                    if (lVar31 == 0x28) goto LAB_0015582f;
                    if (pTVar6->us_preferred[lVar31] == 1) {
                      pTVar27 = (data->req).p.telnet;
                      iVar14 = pTVar27->us[lVar31];
                      if (iVar14 == 3) {
                        if (pTVar27->usq[lVar31] == 0) {
                          pTVar27->usq[lVar31] = 1;
                        }
                      }
                      else if (iVar14 == 2) {
                        if (pTVar27->usq[lVar31] == 1) {
                          pTVar27->usq[lVar31] = 0;
                        }
                      }
                      else if (iVar14 == 0) {
                        pTVar27->us[lVar31] = 2;
                        send_negotiation(data,0xfb,(int)lVar31);
                      }
                    }
                    if (pTVar6->him_preferred[lVar31] == 1) {
                      pTVar27 = (data->req).p.telnet;
                      iVar14 = pTVar27->him[lVar31];
                      if (iVar14 == 3) {
                        if (pTVar27->himq[lVar31] == 0) {
                          pTVar27->himq[lVar31] = 1;
                        }
                      }
                      else if (iVar14 == 2) {
                        if (pTVar27->himq[lVar31] == 1) {
                          pTVar27->himq[lVar31] = 0;
                        }
                      }
                      else if (iVar14 == 0) {
                        pTVar27->him[lVar31] = 2;
                        send_negotiation(data,0xfd,(int)lVar31);
                      }
                    }
                  }
                  lVar31 = lVar31 + 1;
                } while( true );
              }
              goto LAB_00154edf;
            }
LAB_001556f3:
            bVar33 = false;
          }
          goto LAB_00154fd7;
        }
      }
      goto LAB_0015584e;
    }
    curl_slist_free_all(pTVar18->telnet_vars);
    pTVar18->telnet_vars = (curl_slist *)0x0;
  }
  return CVar15;
LAB_0015582f:
  pTVar18->already_negotiated = 1;
LAB_00154edf:
  nread = 0;
  if ((uVar21 & 2) == 0) {
    if ((pfd[1].revents & 1U) != 0) {
      nread = read(pfd[1].fd,buffer,0x1000);
LAB_00154f62:
      if (0 < nread) {
        CVar16 = send_telnet_data(data,buffer,nread);
        CVar15 = CURLE_OK;
        if (CVar16 != CURLE_OK) {
          bVar33 = false;
          CVar15 = CVar16;
          goto LAB_00154fd7;
        }
        local_1048 = local_1048 + nread;
        Curl_pgrsSetUploadCounter(data,local_1048);
        goto LAB_00154fd4;
      }
    }
    bVar33 = nread == 0;
  }
  else {
    sVar24 = (*(data->state).fread_func)(buffer,1,0x1000,(data->state).in);
    iVar14 = (int)sVar24;
    nread = (ssize_t)iVar14;
    if (iVar14 == 0x10000000) {
LAB_00154fb9:
      bVar33 = false;
      goto LAB_00154fd7;
    }
    if (iVar14 != 0x10000001) goto LAB_00154f62;
LAB_00154fd4:
    bVar33 = true;
  }
LAB_00154fd7:
  if ((data->set).timeout != 0) {
    cVar34 = Curl_now();
    uVar7 = (pcVar5->created).tv_sec;
    uVar8 = (pcVar5->created).tv_usec;
    older.tv_usec = uVar8;
    older.tv_sec = uVar7;
    older._12_4_ = 0;
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar34._0_12_,0);
    newer.tv_usec = SUB124(cVar34._0_12_,8);
    tVar25 = Curl_timediff(newer,older);
    if ((long)(ulong)(data->set).timeout <= tVar25) {
      bVar33 = false;
      Curl_failf(data,"Time-out");
      CVar15 = CURLE_OPERATION_TIMEDOUT;
    }
  }
  iVar14 = Curl_pgrsUpdate(data);
  if (iVar14 != 0) {
    CVar15 = CURLE_ABORTED_BY_CALLBACK;
LAB_0015584e:
    Curl_xfer_setup_nop(data);
    return CVar15;
  }
  goto LAB_00154e70;
}

Assistant:

static CURLcode telnet_do(struct Curl_easy *data, bool *done)
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
#ifdef USE_WINSOCK
  WSAEVENT event_handle;
  WSANETWORKEVENTS events;
  HANDLE stdin_handle;
  HANDLE objs[2];
  DWORD  obj_count;
  DWORD  wait_timeout;
  DWORD readfile_read;
  int err;
#else
  timediff_t interval_ms;
  struct pollfd pfd[2];
  int poll_cnt;
  curl_off_t total_dl = 0;
  curl_off_t total_ul = 0;
#endif
  ssize_t nread;
  struct curltime now;
  bool keepon = TRUE;
  char buffer[4*1024];
  struct TELNET *tn;

  *done = TRUE; /* unconditionally */

  result = init_telnet(data);
  if(result)
    return result;

  tn = data->req.p.telnet;

  result = check_telnet_options(data);
  if(result)
    return result;

#ifdef USE_WINSOCK
  /* We want to wait for both stdin and the socket. Since
  ** the select() function in Winsock only works on sockets
  ** we have to use the WaitForMultipleObjects() call.
  */

  /* First, create a sockets event object */
  event_handle = WSACreateEvent();
  if(event_handle == WSA_INVALID_EVENT) {
    failf(data, "WSACreateEvent failed (%d)", SOCKERRNO);
    return CURLE_FAILED_INIT;
  }

  /* Tell Winsock what events we want to listen to */
  if(WSAEventSelect(sockfd, event_handle, FD_READ|FD_CLOSE) == SOCKET_ERROR) {
    WSACloseEvent(event_handle);
    return CURLE_OK;
  }

  /* The get the Windows file handle for stdin */
  stdin_handle = GetStdHandle(STD_INPUT_HANDLE);

  /* Create the list of objects to wait for */
  objs[0] = event_handle;
  objs[1] = stdin_handle;

  /* If stdin_handle is a pipe, use PeekNamedPipe() method to check it,
     else use the old WaitForMultipleObjects() way */
  if(GetFileType(stdin_handle) == FILE_TYPE_PIPE ||
     data->set.is_fread_set) {
    /* Do not wait for stdin_handle, just wait for event_handle */
    obj_count = 1;
    /* Check stdin_handle per 100 milliseconds */
    wait_timeout = 100;
  }
  else {
    obj_count = 2;
    wait_timeout = 1000;
  }

  /* Keep on listening and act on events */
  while(keepon) {
    const DWORD buf_size = (DWORD)sizeof(buffer);
    DWORD waitret = WaitForMultipleObjects(obj_count, objs,
                                           FALSE, wait_timeout);
    switch(waitret) {

    case WAIT_TIMEOUT:
    {
      for(;;) {
        if(data->set.is_fread_set) {
          size_t n;
          /* read from user-supplied method */
          n = data->state.fread_func(buffer, 1, buf_size, data->state.in);
          if(n == CURL_READFUNC_ABORT) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(n == CURL_READFUNC_PAUSE)
            break;

          if(n == 0)                        /* no bytes */
            break;

          /* fall through with number of bytes read */
          readfile_read = (DWORD)n;
        }
        else {
          /* read from stdin */
          if(!PeekNamedPipe(stdin_handle, NULL, 0, NULL,
                            &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(!readfile_read)
            break;

          if(!ReadFile(stdin_handle, buffer, buf_size,
                       &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }
        }

        result = send_telnet_data(data, buffer, readfile_read);
        if(result) {
          keepon = FALSE;
          break;
        }
      }
    }
    break;

    case WAIT_OBJECT_0 + 1:
    {
      if(!ReadFile(stdin_handle, buffer, buf_size,
                   &readfile_read, NULL)) {
        keepon = FALSE;
        result = CURLE_READ_ERROR;
        break;
      }

      result = send_telnet_data(data, buffer, readfile_read);
      if(result) {
        keepon = FALSE;
        break;
      }
    }
    break;

    case WAIT_OBJECT_0:
    {
      events.lNetworkEvents = 0;
      if(WSAEnumNetworkEvents(sockfd, event_handle, &events) == SOCKET_ERROR) {
        err = SOCKERRNO;
        if(err != EINPROGRESS) {
          infof(data, "WSAEnumNetworkEvents failed (%d)", err);
          keepon = FALSE;
          result = CURLE_READ_ERROR;
        }
        break;
      }
      if(events.lNetworkEvents & FD_READ) {
        /* read data from network */
        result = Curl_xfer_recv(data, buffer, sizeof(buffer), &nread);
        /* read would have blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        else if(result) {
          keepon = FALSE;
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        result = telrcv(data, (unsigned char *) buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise do not. We do not want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(data);
          tn->already_negotiated = 1;
        }
      }
      if(events.lNetworkEvents & FD_CLOSE) {
        keepon = FALSE;
      }
    }
    break;

    }

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }
  }

  /* We called WSACreateEvent, so call WSACloseEvent */
  if(!WSACloseEvent(event_handle)) {
    infof(data, "WSACloseEvent failed (%d)", SOCKERRNO);
  }
#else
  pfd[0].fd = sockfd;
  pfd[0].events = POLLIN;

  if(data->set.is_fread_set) {
    poll_cnt = 1;
    interval_ms = 100; /* poll user-supplied read function */
  }
  else {
    /* really using fread, so infile is a FILE* */
    pfd[1].fd = fileno((FILE *)data->state.in);
    pfd[1].events = POLLIN;
    poll_cnt = 2;
    interval_ms = 1 * 1000;
    if(pfd[1].fd < 0) {
      failf(data, "cannot read input");
      result = CURLE_RECV_ERROR;
      keepon = FALSE;
    }
  }

  while(keepon) {
    DEBUGF(infof(data, "telnet_do, poll %d fds", poll_cnt));
    switch(Curl_poll(pfd, (unsigned int)poll_cnt, interval_ms)) {
    case -1:                    /* error, stop reading */
      keepon = FALSE;
      continue;
    case 0:                     /* timeout */
      pfd[0].revents = 0;
      pfd[1].revents = 0;
      FALLTHROUGH();
    default:                    /* read! */
      if(pfd[0].revents & POLLIN) {
        /* read data from network */
        result = Curl_xfer_recv(data, buffer, sizeof(buffer), &nread);
        /* read would have blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        if(result) {
          keepon = FALSE;
          /* TODO: in test 1452, macOS sees a ECONNRESET sometimes?
           * Is this the telnet test server not shutting down the socket
           * in a clean way? Seems to be timing related, happens more
           * on slow debug build */
          if(data->state.os_errno == ECONNRESET) {
            DEBUGF(infof(data, "telnet_do, unexpected ECONNRESET on recv"));
          }
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        total_dl += nread;
        result = Curl_pgrsSetDownloadCounter(data, total_dl);
        if(!result)
          result = telrcv(data, (unsigned char *)buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise do not. We do not want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(data);
          tn->already_negotiated = 1;
        }
      }

      nread = 0;
      if(poll_cnt == 2) {
        if(pfd[1].revents & POLLIN) { /* read from in file */
          nread = read(pfd[1].fd, buffer, sizeof(buffer));
        }
      }
      else {
        /* read from user-supplied method */
        nread = (int)data->state.fread_func(buffer, 1, sizeof(buffer),
                                            data->state.in);
        if(nread == CURL_READFUNC_ABORT) {
          keepon = FALSE;
          break;
        }
        if(nread == CURL_READFUNC_PAUSE)
          break;
      }

      if(nread > 0) {
        result = send_telnet_data(data, buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }
        total_ul += nread;
        Curl_pgrsSetUploadCounter(data, total_ul);
      }
      else if(nread < 0)
        keepon = FALSE;

      break;
    } /* poll switch statement */

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }

    if(Curl_pgrsUpdate(data)) {
      result = CURLE_ABORTED_BY_CALLBACK;
      break;
    }
  }
#endif
  /* mark this as "no further transfer wanted" */
  Curl_xfer_setup_nop(data);

  return result;
}